

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test::
~TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test
          (TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test *this)

{
  TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test *this_local;
  
  ~TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, TestCaseBlockWithAssertions)
{
    junitOutput->setPackageName("packagename");
    testCaseRunner->start()
            .withGroup("groupname")
            .withTest("testname")
            .thatHasChecks(24)
            .end();

    outputFile = fileSystem.file("cpputest_packagename_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"packagename.groupname\" name=\"testname\" assertions=\"24\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
}